

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typemodel.hh
# Opt level: O0

set<const_Typelib::Type_*,_std::less<const_Typelib::Type_*>,_std::allocator<const_Typelib::Type_*>_>
* __thiscall
Typelib::NullType::dependsOn
          (set<const_Typelib::Type_*,_std::less<const_Typelib::Type_*>,_std::allocator<const_Typelib::Type_*>_>
           *__return_storage_ptr__,NullType *this)

{
  NullType *this_local;
  
  memset(__return_storage_ptr__,0,0x30);
  std::
  set<const_Typelib::Type_*,_std::less<const_Typelib::Type_*>,_std::allocator<const_Typelib::Type_*>_>
  ::set(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

virtual std::set<Type const*> dependsOn() const { return std::set<Type const*>(); }